

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

int av1_get_overlap_area(int row_a,int col_a,int row_b,int col_b,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = row_b;
  if (row_b < row_a) {
    iVar3 = row_a;
  }
  if (row_a < row_b) {
    row_b = row_a;
  }
  iVar2 = col_b;
  if (col_b < col_a) {
    iVar2 = col_a;
  }
  if (col_a < col_b) {
    col_b = col_a;
  }
  iVar1 = ((col_b + width) - iVar2) * ((row_b + height) - iVar3);
  if (col_b + width <= iVar2) {
    iVar1 = 0;
  }
  if (row_b + height <= iVar3) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int av1_get_overlap_area(int row_a, int col_a, int row_b, int col_b, int width,
                         int height) {
  int min_row = AOMMAX(row_a, row_b);
  int max_row = AOMMIN(row_a + height, row_b + height);
  int min_col = AOMMAX(col_a, col_b);
  int max_col = AOMMIN(col_a + width, col_b + width);
  if (min_row < max_row && min_col < max_col) {
    return (max_row - min_row) * (max_col - min_col);
  }
  return 0;
}